

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.h
# Opt level: O1

void __thiscall embree::Averaged<double>::add(Averaged<double> *this,double v)

{
  iterator *piVar1;
  _Elt_pointer ppVar2;
  _Map_pointer pppVar3;
  pair<double,_double> local_18;
  
  local_18.first = getSeconds();
  ppVar2 = (this->values).
           super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_18.second = v;
  if (ppVar2 == (this->values).
                super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_first) {
    std::deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    _M_push_front_aux<std::pair<double,double>>
              ((deque<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)this,
               &local_18);
  }
  else {
    ppVar2[-1].first = local_18.first;
    ppVar2[-1].second = v;
    piVar1 = &(this->values).
              super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Deque_impl_data._M_start;
    piVar1->_M_cur = piVar1->_M_cur + -1;
  }
  pppVar3 = (this->values).
            super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (this->N < ((long)(this->values).
                       super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_last -
                 (long)(this->values).
                       super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                ((long)(this->values).
                       super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                 (long)(this->values).
                       super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                ((((ulong)((long)pppVar3 -
                          (long)(this->values).
                                super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                (ulong)(pppVar3 == (_Map_pointer)0x0)) * 0x20) {
    std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::resize
              (&this->values,this->N);
  }
  return;
}

Assistant:

void add(double v)
    {
      values.push_front(std::make_pair(getSeconds(),v));
      if (values.size() > N) values.resize(N);
    }